

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseTernaryExpr(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  Lexeme *pLVar2;
  SynConditional *this;
  SynBase *local_38;
  SynBase *falseBlock;
  SynBase *trueBlock;
  Lexeme *pos;
  SynBase *value;
  ParseContext *ctx_local;
  
  pos = (Lexeme *)ParseArithmetic(ctx);
  if ((SynBase *)pos == (SynBase *)0x0) {
    ctx_local = (ParseContext *)0x0;
  }
  else {
    begin = ctx->currentLexeme;
    while( true ) {
      bVar1 = ParseContext::Consume(ctx,lex_questionmark);
      if (!bVar1) break;
      falseBlock = ParseAssignment(ctx);
      if (falseBlock == (SynBase *)0x0) {
        pLVar2 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: expression not found after \'?\'");
        falseBlock = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar2 = ParseContext::Previous(ctx);
        SynError::SynError((SynError *)falseBlock,begin,pLVar2);
      }
      anon_unknown.dwarf_104b6::CheckConsume
                (ctx,lex_colon,"ERROR: \':\' not found after expression in ternary operator");
      local_38 = ParseAssignment(ctx);
      if (local_38 == (SynBase *)0x0) {
        pLVar2 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: expression not found after \':\'");
        local_38 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar2 = ParseContext::Previous(ctx);
        SynError::SynError((SynError *)local_38,begin,pLVar2);
      }
      this = ParseContext::get<SynConditional>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      SynConditional::SynConditional(this,begin,pLVar2,(SynBase *)pos,falseBlock,local_38);
      pos = (Lexeme *)this;
    }
    ctx_local = (ParseContext *)pos;
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseTernaryExpr(ParseContext &ctx)
{
	if(SynBase *value = ParseArithmetic(ctx))
	{
		Lexeme *pos = ctx.currentLexeme;

		while(ctx.Consume(lex_questionmark))
		{
			SynBase *trueBlock = ParseAssignment(ctx);

			if(!trueBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '?'");

				trueBlock = new (ctx.get<SynError>()) SynError(pos, ctx.Previous());
			}

			CheckConsume(ctx, lex_colon, "ERROR: ':' not found after expression in ternary operator");

			SynBase *falseBlock = ParseAssignment(ctx);

			if(!falseBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after ':'");

				falseBlock = new (ctx.get<SynError>()) SynError(pos, ctx.Previous());
			}

			value = new (ctx.get<SynConditional>()) SynConditional(pos, ctx.Previous(), value, trueBlock, falseBlock);
		}

		return value;
	}

	return NULL;
}